

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3auxDisconnectMethod(sqlite3_vtab *pVtab)

{
  sqlite3_module *psVar1;
  long lVar2;
  
  psVar1 = pVtab[1].pModule;
  lVar2 = 0xd;
  do {
    sqlite3_finalize(*(sqlite3_stmt **)(&psVar1->iVersion + lVar2 * 2));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x35);
  sqlite3_free(psVar1[2].xEof);
  sqlite3_free(pVtab);
  return 0;
}

Assistant:

static int fts3auxDisconnectMethod(sqlite3_vtab *pVtab){
  Fts3auxTable *p = (Fts3auxTable *)pVtab;
  Fts3Table *pFts3 = p->pFts3Tab;
  int i;

  /* Free any prepared statements held */
  for(i=0; i<SizeofArray(pFts3->aStmt); i++){
    sqlite3_finalize(pFts3->aStmt[i]);
  }
  sqlite3_free(pFts3->zSegmentsTbl);
  sqlite3_free(p);
  return SQLITE_OK;
}